

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.c
# Opt level: O1

void dump_mpp_frame_to_file(MppFrame frame,FILE *fp)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  long lVar7;
  RK_U8 *pRVar8;
  RK_U8 *pRVar9;
  RK_U8 *base_y;
  ulong uVar10;
  ulong uVar11;
  RK_U8 *pRVar12;
  RK_U8 *pRVar13;
  RK_U32 RVar14;
  
  if (frame == (MppFrame)0x0 || fp == (FILE *)0x0) {
    return;
  }
  uVar1 = mpp_frame_get_width();
  uVar11 = (ulong)uVar1;
  uVar2 = mpp_frame_get_height(frame);
  uVar3 = mpp_frame_get_hor_stride(frame);
  iVar4 = mpp_frame_get_ver_stride(frame);
  uVar5 = mpp_frame_get_fmt(frame);
  lVar7 = mpp_frame_get_buffer(frame);
  if (lVar7 == 0) {
    return;
  }
  pRVar8 = (RK_U8 *)mpp_buffer_get_ptr_with_caller(lVar7,"dump_mpp_frame_to_file");
  if ((uVar5 & 0xf0000) == 0x10000) {
    uVar6 = uVar5 & 0x1ffff;
    if ((uVar5 >> 0x18 & 1) == 0) {
      uVar6 = uVar5;
    }
    if ((uVar5 & 0x1ffff) < 0x10010) {
      uVar5 = uVar6;
    }
  }
  uVar6 = uVar5 & 0xfffff;
  if (0xffff < uVar6) {
    if (5 < uVar6 - 0x10000) {
      if (uVar6 - 0x1000a < 4) {
        pRVar9 = (RK_U8 *)mpp_osal_malloc("dump_mpp_frame_to_file",uVar2 * uVar1 * 4);
        if (uVar2 != 0) {
          do {
            fwrite(pRVar8,1,(ulong)(uVar1 << 2),(FILE *)fp);
            pRVar8 = pRVar8 + uVar3;
            uVar2 = uVar2 - 1;
          } while (uVar2 != 0);
        }
      }
      else {
        if (uVar6 != 0x10006) goto switchD_00104a44_caseD_3;
        pRVar9 = (RK_U8 *)mpp_osal_malloc("dump_mpp_frame_to_file",uVar2 * uVar1 * 3);
        if (uVar2 != 0) {
          do {
            fwrite(pRVar8,1,(ulong)(uVar1 * 3),(FILE *)fp);
            pRVar8 = pRVar8 + uVar3;
            uVar2 = uVar2 - 1;
          } while (uVar2 != 0);
        }
      }
      goto LAB_00104b6e;
    }
switchD_00104a44_caseD_8:
    pRVar9 = (RK_U8 *)mpp_osal_malloc("dump_mpp_frame_to_file",uVar2 * uVar1 * 2);
    if (uVar2 != 0) {
      do {
        fwrite(pRVar8,1,(ulong)(uVar1 * 2),(FILE *)fp);
        pRVar8 = pRVar8 + uVar3;
        uVar2 = uVar2 - 1;
      } while (uVar2 != 0);
    }
    goto LAB_00104b6e;
  }
  switch(uVar6) {
  case 0:
  case 5:
    pRVar9 = pRVar8;
    for (uVar5 = uVar2; uVar5 != 0; uVar5 = uVar5 - 1) {
      fwrite(pRVar9,1,uVar11,(FILE *)fp);
      pRVar9 = pRVar9 + uVar3;
    }
    if (uVar2 < 2) {
      return;
    }
    pRVar8 = pRVar8 + iVar4 * uVar3;
    uVar2 = uVar2 >> 1;
    do {
      fwrite(pRVar8,1,uVar11,(FILE *)fp);
      pRVar8 = pRVar8 + uVar3;
      uVar2 = uVar2 - 1;
    } while (uVar2 != 0);
    return;
  case 1:
    pRVar9 = (RK_U8 *)mpp_osal_malloc("dump_mpp_frame_to_file");
    if (pRVar9 == (RK_U8 *)0x0) {
LAB_00105122:
      _mpp_log_l(4,"utils","tmp_line malloc fail",0);
      return;
    }
    if (uVar2 != 0) {
      uVar5 = 0;
      pRVar13 = pRVar8;
      do {
        if (7 < uVar1 + 7) {
          RVar14 = 0;
          do {
            rearrange_pix(pRVar9,pRVar13,RVar14);
            RVar14 = RVar14 + 1;
          } while (uVar1 + 7 >> 3 != RVar14);
        }
        fwrite(pRVar9,uVar11 * 2,1,(FILE *)fp);
        uVar5 = uVar5 + 1;
        pRVar13 = pRVar13 + uVar3;
      } while (uVar5 != uVar2);
    }
    if (1 < uVar2) {
      pRVar8 = pRVar8 + iVar4 * uVar3;
      uVar5 = 0;
      do {
        if (7 < uVar1 + 7) {
          RVar14 = 0;
          do {
            rearrange_pix(pRVar9,pRVar8,RVar14);
            RVar14 = RVar14 + 1;
          } while (uVar1 + 7 >> 3 != RVar14);
        }
        fwrite(pRVar9,uVar11 * 2,1,(FILE *)fp);
        uVar5 = uVar5 + 1;
        pRVar8 = pRVar8 + uVar3;
      } while (uVar5 != uVar2 >> 1);
    }
    break;
  case 2:
    pRVar9 = (RK_U8 *)mpp_osal_malloc("dump_mpp_frame_to_file",uVar3 * uVar2 * 2);
    uVar5 = uVar2 * uVar1;
    if (uVar2 != 0) {
      pRVar13 = pRVar8 + iVar4 * uVar3;
      uVar6 = uVar2;
      do {
        fwrite(pRVar8,1,uVar11,(FILE *)fp);
        pRVar8 = pRVar8 + uVar3;
        uVar6 = uVar6 - 1;
      } while (uVar6 != 0);
      uVar6 = 0;
      pRVar8 = pRVar9;
      do {
        if (1 < uVar1) {
          uVar11 = 0;
          do {
            pRVar8[uVar11] = pRVar13[uVar11 * 2];
            pRVar8[uVar11 + (uVar5 >> 1)] = pRVar13[uVar11 * 2 + 1];
            uVar11 = uVar11 + 1;
          } while (uVar1 >> 1 != uVar11);
        }
        pRVar8 = pRVar8 + (uVar1 >> 1);
        uVar6 = uVar6 + 1;
        pRVar13 = pRVar13 + uVar3;
      } while (uVar6 != uVar2);
    }
    goto LAB_001050db;
  default:
switchD_00104a44_caseD_3:
    _mpp_log_l(2,"utils","not supported format %d\n",0,uVar5);
    return;
  case 4:
    pRVar9 = pRVar8;
    for (uVar5 = uVar2; uVar5 != 0; uVar5 = uVar5 - 1) {
      fwrite(pRVar9,1,uVar11,(FILE *)fp);
      pRVar9 = pRVar9 + uVar3;
    }
    pRVar8 = pRVar8 + iVar4 * uVar3;
    uVar5 = uVar2 >> 1;
    if (1 < uVar2) {
      uVar6 = uVar5;
      do {
        fwrite(pRVar8,1,(ulong)(uVar1 >> 1),(FILE *)fp);
        pRVar8 = pRVar8 + (uVar3 >> 1);
        uVar6 = uVar6 - 1;
      } while (uVar6 != 0);
    }
    if (1 < uVar2) {
      do {
        fwrite(pRVar8,1,(ulong)(uVar1 >> 1),(FILE *)fp);
        pRVar8 = pRVar8 + (uVar3 >> 1);
        uVar5 = uVar5 - 1;
      } while (uVar5 != 0);
    }
    return;
  case 8:
  case 9:
  case 10:
  case 0xb:
    goto switchD_00104a44_caseD_8;
  case 0xc:
    pRVar9 = (RK_U8 *)mpp_osal_malloc("dump_mpp_frame_to_file",uVar3 * uVar2);
    for (; uVar2 != 0; uVar2 = uVar2 - 1) {
      fwrite(pRVar8,1,uVar11,(FILE *)fp);
      pRVar8 = pRVar8 + uVar3;
    }
    break;
  case 0xf:
    pRVar9 = (RK_U8 *)mpp_osal_malloc("dump_mpp_frame_to_file",uVar3 * uVar2 * 2);
    if (uVar2 != 0) {
      pRVar13 = pRVar8 + iVar4 * uVar3;
      uVar5 = uVar2;
      do {
        fwrite(pRVar8,1,uVar11,(FILE *)fp);
        pRVar8 = pRVar8 + uVar3;
        uVar5 = uVar5 - 1;
      } while (uVar5 != 0);
      uVar5 = 0;
      pRVar8 = pRVar9;
      do {
        if (uVar1 != 0) {
          uVar10 = 0;
          pRVar12 = pRVar8;
          do {
            *pRVar12 = pRVar13[uVar10 & 0xffffffff];
            pRVar12[uVar2 * uVar1] = pRVar13[(int)uVar10 + 1];
            pRVar12 = pRVar12 + 1;
            uVar10 = uVar10 + 2;
          } while (uVar11 * 2 != uVar10);
        }
        pRVar8 = pRVar8 + uVar11;
        uVar5 = uVar5 + 1;
        pRVar13 = pRVar13 + uVar3 * 2;
      } while (uVar5 != uVar2);
    }
    uVar5 = uVar2 * uVar1 * 2;
LAB_001050db:
    fwrite(pRVar9,1,(ulong)uVar5,(FILE *)fp);
    break;
  case 0x11:
    pRVar9 = (RK_U8 *)mpp_osal_malloc("dump_mpp_frame_to_file");
    if (pRVar9 == (RK_U8 *)0x0) goto LAB_00105122;
    if (uVar2 != 0) {
      uVar5 = 0;
      pRVar13 = pRVar8;
      do {
        if (7 < uVar1 + 7) {
          RVar14 = 0;
          do {
            rearrange_pix(pRVar9,pRVar13,RVar14);
            RVar14 = RVar14 + 1;
          } while (uVar1 + 7 >> 3 != RVar14);
        }
        fwrite(pRVar9,uVar11 * 2,1,(FILE *)fp);
        uVar5 = uVar5 + 1;
        pRVar13 = pRVar13 + uVar3;
      } while (uVar5 != uVar2);
    }
    if (uVar2 * 2 != 0) {
      pRVar8 = pRVar8 + iVar4 * uVar3;
      iVar4 = 0;
      do {
        if (7 < uVar1 + 7) {
          RVar14 = 0;
          do {
            rearrange_pix(pRVar9,pRVar8,RVar14);
            RVar14 = RVar14 + 1;
          } while (uVar1 + 7 >> 3 != RVar14);
        }
        fwrite(pRVar9,uVar11 * 2,1,(FILE *)fp);
        iVar4 = iVar4 + 1;
        pRVar8 = pRVar8 + uVar3;
      } while (iVar4 != uVar2 * 2);
    }
  }
LAB_00104b6e:
  mpp_osal_free("dump_mpp_frame_to_file",pRVar9);
  return;
}

Assistant:

void dump_mpp_frame_to_file(MppFrame frame, FILE *fp)
{
    RK_U32 width    = 0;
    RK_U32 height   = 0;
    RK_U32 h_stride = 0;
    RK_U32 v_stride = 0;
    MppFrameFormat fmt  = MPP_FMT_YUV420SP;
    MppBuffer buffer    = NULL;
    RK_U8 *base = NULL;

    if (NULL == fp || NULL == frame)
        return ;

    width    = mpp_frame_get_width(frame);
    height   = mpp_frame_get_height(frame);
    h_stride = mpp_frame_get_hor_stride(frame);
    v_stride = mpp_frame_get_ver_stride(frame);
    fmt      = mpp_frame_get_fmt(frame);
    buffer   = mpp_frame_get_buffer(frame);

    if (NULL == buffer)
        return ;

    base = (RK_U8 *)mpp_buffer_get_ptr(buffer);

    if (MPP_FRAME_FMT_IS_RGB(fmt) && MPP_FRAME_FMT_IS_LE(fmt)) {
        fmt &= MPP_FRAME_FMT_MASK;
    }
    switch (fmt & MPP_FRAME_FMT_MASK) {
    case MPP_FMT_YUV422SP : {
        /* YUV422SP -> YUV422P for better display */
        RK_U32 i, j;
        RK_U8 *base_y = base;
        RK_U8 *base_c = base + h_stride * v_stride;
        RK_U8 *tmp = mpp_malloc(RK_U8, h_stride * height * 2);
        RK_U8 *tmp_u = tmp;
        RK_U8 *tmp_v = tmp + width * height / 2;

        for (i = 0; i < height; i++, base_y += h_stride)
            fwrite(base_y, 1, width, fp);

        for (i = 0; i < height; i++, base_c += h_stride) {
            for (j = 0; j < width / 2; j++) {
                tmp_u[j] = base_c[2 * j + 0];
                tmp_v[j] = base_c[2 * j + 1];
            }
            tmp_u += width / 2;
            tmp_v += width / 2;
        }

        fwrite(tmp, 1, width * height, fp);
        mpp_free(tmp);
    } break;
    case MPP_FMT_YUV420SP_VU :
    case MPP_FMT_YUV420SP : {
        RK_U32 i;
        RK_U8 *base_y = base;
        RK_U8 *base_c = base + h_stride * v_stride;

        for (i = 0; i < height; i++, base_y += h_stride) {
            fwrite(base_y, 1, width, fp);
        }
        for (i = 0; i < height / 2; i++, base_c += h_stride) {
            fwrite(base_c, 1, width, fp);
        }
    } break;
    case MPP_FMT_YUV420P : {
        RK_U32 i;
        RK_U8 *base_y = base;
        RK_U8 *base_c = base + h_stride * v_stride;

        for (i = 0; i < height; i++, base_y += h_stride) {
            fwrite(base_y, 1, width, fp);
        }
        for (i = 0; i < height / 2; i++, base_c += h_stride / 2) {
            fwrite(base_c, 1, width / 2, fp);
        }
        for (i = 0; i < height / 2; i++, base_c += h_stride / 2) {
            fwrite(base_c, 1, width / 2, fp);
        }
    } break;
    case MPP_FMT_YUV420SP_10BIT : {
        RK_U32 i, k;
        RK_U8 *base_y = base;
        RK_U8 *base_c = base + h_stride * v_stride;
        RK_U8 *tmp_line = (RK_U8 *)mpp_malloc(RK_U16, width);

        if (!tmp_line) {
            mpp_log("tmp_line malloc fail");
            return;
        }

        for (i = 0; i < height; i++, base_y += h_stride) {
            for (k = 0; k < MPP_ALIGN(width, 8) / 8; k++)
                rearrange_pix(tmp_line, base_y, k);
            fwrite(tmp_line, width * sizeof(RK_U16), 1, fp);
        }

        for (i = 0; i < height / 2; i++, base_c += h_stride) {
            for (k = 0; k < MPP_ALIGN(width, 8) / 8; k++)
                rearrange_pix(tmp_line, base_c, k);
            fwrite(tmp_line, width * sizeof(RK_U16), 1, fp);
        }

        MPP_FREE(tmp_line);
    } break;
    case MPP_FMT_YUV444SP : {
        /* YUV444SP -> YUV444P for better display */
        RK_U32 i, j;
        RK_U8 *base_y = base;
        RK_U8 *base_c = base + h_stride * v_stride;
        RK_U8 *tmp = mpp_malloc(RK_U8, h_stride * height * 2);
        RK_U8 *tmp_u = tmp;
        RK_U8 *tmp_v = tmp + width * height;

        for (i = 0; i < height; i++, base_y += h_stride)
            fwrite(base_y, 1, width, fp);

        for (i = 0; i < height; i++, base_c += h_stride * 2) {
            for (j = 0; j < width; j++) {
                tmp_u[j] = base_c[2 * j + 0];
                tmp_v[j] = base_c[2 * j + 1];
            }
            tmp_u += width;
            tmp_v += width;
        }

        fwrite(tmp, 1, width * height * 2, fp);
        mpp_free(tmp);
    } break;
    case MPP_FMT_YUV444SP_10BIT : {
        RK_U32 i, k;
        RK_U8 *base_y = base;
        RK_U8 *base_c = base + h_stride * v_stride;
        RK_U8 *tmp_line = (RK_U8 *)mpp_malloc(RK_U16, width);

        if (!tmp_line) {
            mpp_log("tmp_line malloc fail");
            return;
        }

        for (i = 0; i < height; i++, base_y += h_stride) {
            for (k = 0; k < MPP_ALIGN(width, 8) / 8; k++)
                rearrange_pix(tmp_line, base_y, k);
            fwrite(tmp_line, width * sizeof(RK_U16), 1, fp);
        }

        for (i = 0; i < (height * 2); i++, base_c += h_stride) {
            for (k = 0; k < MPP_ALIGN(width, 8) / 8; k++)
                rearrange_pix(tmp_line, base_c, k);
            fwrite(tmp_line, width * sizeof(RK_U16), 1, fp);
        }

        MPP_FREE(tmp_line);
    } break;
    case MPP_FMT_YUV400: {
        RK_U32 i;
        RK_U8 *base_y = base;
        RK_U8 *tmp = mpp_malloc(RK_U8, h_stride * height);

        for (i = 0; i < height; i++, base_y += h_stride)
            fwrite(base_y, 1, width, fp);

        mpp_free(tmp);
    } break;
    case MPP_FMT_ARGB8888:
    case MPP_FMT_ABGR8888:
    case MPP_FMT_BGRA8888:
    case MPP_FMT_RGBA8888: {
        RK_U32 i;
        RK_U8 *base_y = base;
        RK_U8 *tmp = mpp_malloc(RK_U8, width * height * 4);

        for (i = 0; i < height; i++, base_y += h_stride)
            fwrite(base_y, 1, width * 4, fp);

        mpp_free(tmp);
    } break;
    case MPP_FMT_YUV422_YUYV:
    case MPP_FMT_YUV422_YVYU:
    case MPP_FMT_YUV422_UYVY:
    case MPP_FMT_YUV422_VYUY:
    case MPP_FMT_RGB565:
    case MPP_FMT_BGR565:
    case MPP_FMT_RGB555:
    case MPP_FMT_BGR555:
    case MPP_FMT_RGB444:
    case MPP_FMT_BGR444: {
        RK_U32 i;
        RK_U8 *base_y = base;
        RK_U8 *tmp = mpp_malloc(RK_U8, width * height * 2);

        for (i = 0; i < height; i++, base_y += h_stride)
            fwrite(base_y, 1, width * 2, fp);

        mpp_free(tmp);
    } break;
    case MPP_FMT_RGB888: {
        RK_U32 i;
        RK_U8 *base_y = base;
        RK_U8 *tmp = mpp_malloc(RK_U8, width * height * 3);

        for (i = 0; i < height; i++, base_y += h_stride)
            fwrite(base_y, 1, width * 3, fp);

        mpp_free(tmp);
    } break;
    default : {
        mpp_err("not supported format %d\n", fmt);
    } break;
    }
}